

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.c
# Opt level: O0

decNumber_conflict * decNumberExp(decNumber_conflict *res,decNumber_conflict *rhs,decContext *set)

{
  uint32_t uVar1;
  uint32_t local_24;
  decContext *pdStack_20;
  uint32_t status;
  decContext *set_local;
  decNumber_conflict *rhs_local;
  decNumber_conflict *res_local;
  
  local_24 = 0;
  pdStack_20 = set;
  set_local = (decContext *)rhs;
  rhs_local = res;
  uVar1 = decCheckMath(rhs,set,&local_24);
  if (uVar1 == 0) {
    decExpOp(rhs_local,(decNumber_conflict *)set_local,pdStack_20,&local_24);
  }
  if (local_24 != 0) {
    decStatus(rhs_local,local_24,pdStack_20);
  }
  return rhs_local;
}

Assistant:

decNumber * decNumberExp(decNumber *res, const decNumber *rhs,
			 decContext *set) {
  uInt status=0;			/* accumulator */
  #if DECSUBSET
  decNumber *allocrhs=NULL;	   /* non-NULL if rounded rhs allocated */
  #endif

  #if DECCHECK
  if (decCheckOperands(res, DECUNUSED, rhs, set)) return res;
  #endif

  /* Check restrictions; these restrictions ensure that if h=8 (see */
  /* decExpOp) then the result will either overflow or underflow to 0. */
  /* Other math functions restrict the input range, too, for inverses. */
  /* If not violated then carry out the operation. */
  if (!decCheckMath(rhs, set, &status)) do { /* protect allocation */
    #if DECSUBSET
    if (!set->extended) {
      /* reduce operand and set lostDigits status, as needed */
      if (rhs->digits>set->digits) {
	allocrhs=decRoundOperand(rhs, set, &status);
	if (allocrhs==NULL) break;
	rhs=allocrhs;
	}
      }
    #endif
    decExpOp(res, rhs, set, &status);
    } while(0);				/* end protected */

  #if DECSUBSET
  if (allocrhs !=NULL) free(allocrhs);	/* drop any storage used */
  #endif
  /* apply significant status */
  if (status!=0) decStatus(res, status, set);
  #if DECCHECK
  decCheckInexact(res, set);
  #endif
  return res;
  }